

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

Texture2D *
glu::Texture2D::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          char **levelFileNames)

{
  bool bVar1;
  deBool dVar2;
  uint uVar3;
  int width;
  int height;
  InternalError *this;
  Texture2D *this_00;
  Texture2D *pTVar4;
  EVP_PKEY_CTX *pEVar5;
  reference pvVar6;
  TestError *this_01;
  bool local_1a2;
  bool local_191;
  TexDecompressionParams local_17c;
  int local_178;
  allocator<tcu::CompressedTexture> local_171;
  int ndx;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  exception *anon_var_0;
  int local_11c;
  int levelNdx;
  Texture2D *local_f0;
  Texture2D *texture;
  TextureFormat local_dc;
  byte local_d1;
  bool isRGBA;
  TextureFormat local_c8;
  TextureFormat local_c0;
  TextureFormat local_b8;
  undefined1 local_b0 [8];
  TextureLevel level;
  FilePath local_78;
  undefined1 local_58 [8];
  string ext;
  char **levelFileNames_local;
  int numLevels_local;
  Archive *archive_local;
  ContextInfo *contextInfo_local;
  RenderContext *context_local;
  
  ext.field_2._8_8_ = levelFileNames;
  de::FilePath::FilePath(&local_78,*levelFileNames);
  de::FilePath::getFileExtension_abi_cxx11_((string *)local_58,&local_78);
  de::FilePath::~FilePath(&local_78);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"png");
  if (bVar1) {
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_b0);
    tcu::ImageIO::loadPNG((TextureLevel *)local_b0,archive,*(char **)ext.field_2._8_8_);
    do {
      dVar2 = ::deGetFalse();
      local_191 = false;
      if (dVar2 == 0) {
        local_b8 = tcu::TextureLevel::getFormat((TextureLevel *)local_b0);
        tcu::TextureFormat::TextureFormat(&local_c0,RGBA,UNORM_INT8);
        bVar1 = tcu::TextureFormat::operator==(&local_b8,&local_c0);
        local_1a2 = true;
        if (!bVar1) {
          local_c8 = tcu::TextureLevel::getFormat((TextureLevel *)local_b0);
          tcu::TextureFormat::TextureFormat
                    ((TextureFormat *)&stack0xffffffffffffff30,RGB,UNORM_INT8);
          local_1a2 = tcu::TextureFormat::operator==
                                (&local_c8,(TextureFormat *)&stack0xffffffffffffff30);
        }
        local_191 = local_1a2;
      }
      if (((local_191 ^ 0xffU) & 1) != 0) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,(char *)0x0,
                   "level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) || level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0xe6);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    local_dc = tcu::TextureLevel::getFormat((TextureLevel *)local_b0);
    tcu::TextureFormat::TextureFormat((TextureFormat *)((long)&texture + 4),RGBA,UNORM_INT8);
    local_d1 = tcu::TextureFormat::operator==(&local_dc,(TextureFormat *)((long)&texture + 4));
    this_00 = (Texture2D *)operator_new(0x70);
    uVar3 = (uint)local_d1;
    width = tcu::TextureLevel::getWidth((TextureLevel *)local_b0);
    height = tcu::TextureLevel::getHeight((TextureLevel *)local_b0);
    Texture2D(this_00,context,(uVar3 & 1) + 0x1907,0x1401,width,height);
    local_f0 = this_00;
    pTVar4 = getRefTexture(this_00);
    tcu::Texture2D::allocLevel(pTVar4,0);
    pTVar4 = getRefTexture(local_f0);
    pEVar5 = (EVP_PKEY_CTX *)
             tcu::TextureLevelPyramid::getLevel(&pTVar4->super_TextureLevelPyramid,0);
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&stack0xfffffffffffffee8,(TextureLevel *)local_b0);
    tcu::copy(pEVar5,(EVP_PKEY_CTX *)&stack0xfffffffffffffee8);
    for (local_11c = 1; local_11c < numLevels; local_11c = local_11c + 1) {
      tcu::ImageIO::loadPNG
                ((TextureLevel *)local_b0,archive,
                 *(char **)(ext.field_2._8_8_ + (long)local_11c * 8));
      pTVar4 = getRefTexture(local_f0);
      tcu::Texture2D::allocLevel(pTVar4,local_11c);
      pTVar4 = getRefTexture(local_f0);
      pEVar5 = (EVP_PKEY_CTX *)
               tcu::TextureLevelPyramid::getLevel(&pTVar4->super_TextureLevelPyramid,local_11c);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&anon_var_0,(TextureLevel *)local_b0);
      tcu::copy(pEVar5,(EVP_PKEY_CTX *)&anon_var_0);
    }
    (*local_f0->_vptr_Texture2D[2])();
    context_local = (RenderContext *)local_f0;
    levels.super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"pkm");
    if (!bVar1) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Unsupported file format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x110);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::allocator<tcu::CompressedTexture>::allocator(&local_171);
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)&ndx,
               (long)numLevels,&local_171);
    std::allocator<tcu::CompressedTexture>::~allocator(&local_171);
    for (local_178 = 0; local_178 < numLevels; local_178 = local_178 + 1) {
      pvVar6 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::
               operator[]((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *
                          )&ndx,(long)local_178);
      tcu::ImageIO::loadPKM(pvVar6,archive,*(char **)(ext.field_2._8_8_ + (long)local_178 * 8));
    }
    context_local = (RenderContext *)operator_new(0x70);
    pvVar6 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::
             operator[]((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)
                        &ndx,0);
    tcu::TexDecompressionParams::TexDecompressionParams(&local_17c,ASTCMODE_LAST);
    Texture2D((Texture2D *)context_local,context,contextInfo,numLevels,pvVar6,&local_17c);
    levels.super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector
              ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)&ndx);
  }
  std::__cxx11::string::~string((string *)local_58);
  return (Texture2D *)context_local;
}

Assistant:

Texture2D* Texture2D::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const char* const* levelFileNames)
{
	DE_ASSERT(numLevels > 0);

	std::string ext = de::FilePath(levelFileNames[0]).getFileExtension();

	if (ext == "png")
	{
		// Uncompressed texture.

		tcu::TextureLevel level;

		// Load level 0.
		tcu::ImageIO::loadPNG(level, archive, levelFileNames[0]);

		TCU_CHECK_INTERNAL(level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) ||
						   level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8));

		bool		isRGBA		= level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
		Texture2D*	texture		= new Texture2D(context, isRGBA ? GL_RGBA : GL_RGB, GL_UNSIGNED_BYTE, level.getWidth(), level.getHeight());

		try
		{
			// Fill level 0.
			texture->getRefTexture().allocLevel(0);
			tcu::copy(texture->getRefTexture().getLevel(0), level.getAccess());

			// Fill remaining levels.
			for (int levelNdx = 1; levelNdx < numLevels; levelNdx++)
			{
				tcu::ImageIO::loadPNG(level, archive, levelFileNames[levelNdx]);

				texture->getRefTexture().allocLevel(levelNdx);
				tcu::copy(texture->getRefTexture().getLevel(levelNdx), level.getAccess());
			}

			// Upload data.
			texture->upload();
		}
		catch (const std::exception&)
		{
			delete texture;
			throw;
		}

		return texture;
	}
	else if (ext == "pkm")
	{
		// Compressed texture.
		vector<tcu::CompressedTexture> levels(numLevels);

		for (int ndx = 0; ndx < numLevels; ndx++)
			tcu::ImageIO::loadPKM(levels[ndx], archive, levelFileNames[ndx]);

		return new Texture2D(context, contextInfo, numLevels, &levels[0]);
	}
	else
		TCU_FAIL("Unsupported file format");
}